

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O3

size_t __thiscall
pstack::Procman::CoreProcess::getRegs
          (CoreProcess *this,lwpid_t lwpid,int code,size_t size,void *data)

{
  _Rb_tree_header *p_Var1;
  Elf64_Word EVar2;
  pointer pNVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  _Base_ptr p_Var9;
  undefined1 local_1a8 [8];
  elf_prstatus prstatus;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  
  p_Var9 = (this->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var9 != (_Base_ptr)0x0) {
    p_Var1 = &(this->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    do {
      if (lwpid <= (int)p_Var9[1]._M_color) {
        p_Var7 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < lwpid];
    } while (p_Var9 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 != p_Var1) && ((int)p_Var7[1]._M_color <= lwpid)) {
      p_Var9 = p_Var7[1]._M_parent;
      pNVar3 = (this->notes).
               super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      EVar2 = pNVar3[(long)p_Var9].note.n_type;
      lVar5 = (long)p_Var9 * 0x20;
      while( true ) {
        do {
          lVar4 = lVar5;
          if (EVar2 == code) {
            if (code == 1) {
              pstack::Elf::NoteDesc::data();
              Reader::readObj<elf_prstatus>
                        ((Reader *)prstatus._328_8_,0,(elf_prstatus *)local_1a8,1);
              if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
              }
              if (0xd7 < size) {
                size = 0xd8;
              }
              memcpy(data,&prstatus.pr_cstime.tv_usec,size);
              return size;
            }
            pstack::Elf::NoteDesc::data();
            uVar8 = (**(code **)(*(long *)local_1a8 + 0x40))();
            if (uVar8 < size) {
              size = uVar8;
            }
            if (prstatus.pr_info._0_8_ != 0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)prstatus.pr_info._0_8_);
            }
            pstack::Elf::NoteDesc::data();
            (**(code **)(*(long *)local_1a8 + 0x10))(local_1a8,0,size,data);
            if (prstatus.pr_info._0_8_ != 0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)prstatus.pr_info._0_8_);
              return size;
            }
            return size;
          }
          p_Var9 = (_Base_ptr)((long)&p_Var9->_M_color + 1);
          if (p_Var9 == (_Base_ptr)
                        ((long)(this->notes).
                               super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar3 >> 5)) {
            return 0;
          }
          EVar2 = *(Elf64_Word *)((long)&pNVar3[1].note.n_type + lVar4);
          lVar5 = lVar4 + 0x20;
        } while (EVar2 != 1);
        pstack::Elf::NoteDesc::name_abi_cxx11_();
        iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1a8,"CORE");
        if (local_1a8 != (undefined1  [8])&prstatus.pr_info.si_errno) {
          operator_delete((void *)local_1a8,prstatus._8_8_ + 1);
        }
        if (iVar6 == 0) break;
        pNVar3 = (this->notes).
                 super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        EVar2 = *(Elf64_Word *)((long)&pNVar3[1].note.n_type + lVar4);
      }
    }
  }
  return 0;
}

Assistant:

size_t
CoreProcess::getRegs(lwpid_t lwpid, int code, size_t size, void *data)
{
   auto idx = lwpToPrStatusIdx.find( lwpid );
   if ( idx == lwpToPrStatusIdx.end() ) {
      return 0;
   }
   for (size_t i = idx->second;;) {
      if (notes[i].type() == code) {
         if (code == NT_PRSTATUS) {
            auto prstatus = notes[i].data()->readObj<prstatus_t>(0);
            size = std::min(size, sizeof prstatus.pr_reg);
            memcpy(data, &prstatus.pr_reg, size);
         } else {
            size = std::min(size, size_t(notes[i].data()->size()));
            notes[i].data()->read(0, size, reinterpret_cast<char *>(data));
         }
         return size;
      }
      ++i;
      if (i == notes.size() || ( notes[i].type() == NT_PRSTATUS && notes[i].name() == "CORE") ) {
         // We're done if that's all the notes, or the next note is the start of a new LWP.
         break;
      }
   }
   return 0;
}